

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void av1_fwd_txfm2d_64x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  __m256i *palVar6;
  ulong uVar7;
  __m256i *palVar8;
  longlong *plVar9;
  __m256i buf0 [512];
  __m256i buf1 [512];
  longlong local_8060 [4];
  longlong local_8040 [2044];
  longlong local_4060 [4];
  longlong local_4040 [2050];
  
  piVar2 = av1_fwd_txfm_shift_ls[4];
  uVar5 = (ulong)(uint)bd;
  palVar6 = &local_8060;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x20) {
    uVar5 = 8;
    load_buffer_16xn_avx2((int16_t *)((long)input + lVar3),palVar6,stride,0x40,8,0,0);
    cVar1 = *piVar2;
    round_shift_32_8xn_avx2(palVar6,0x40,(int)cVar1,8);
    palVar8 = palVar6 + 1;
    round_shift_32_8xn_avx2(palVar8,0x40,(int)cVar1,8);
    fdct64_avx2(palVar6,palVar6,'\r',8,(int)uVar5);
    fdct64_avx2(palVar8,palVar8,'\r',8,(int)uVar5);
    cVar1 = piVar2[1];
    round_shift_32_8xn_avx2(palVar6,0x40,(int)cVar1,8);
    round_shift_32_8xn_avx2(palVar8,0x40,(int)cVar1,8);
    palVar6 = palVar6 + 2;
  }
  plVar9 = local_8060;
  palVar6 = &local_4060;
  uVar4 = 0x80;
  for (uVar7 = 0; uVar7 < 0x40; uVar7 = uVar7 + 8) {
    palVar8 = palVar6;
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 0x20) {
      uVar4 = 8;
      fwd_txfm_transpose_8x8_avx2((__m256i *)((long)plVar9 + lVar3),palVar8,8,8);
      palVar8 = palVar8 + 0x40;
    }
    plVar9 = plVar9 + 0x100;
    palVar6 = palVar6 + 1;
  }
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x40) {
    fdct64_avx2((__m256i *)((long)local_4060 + lVar3),(__m256i *)((long)local_8060 + lVar3),'\n',4,
                (int)uVar5);
    fdct64_avx2((__m256i *)((long)local_4040 + lVar3),(__m256i *)((long)local_8040 + lVar3),'\n',4,
                (int)uVar5);
    cVar1 = piVar2[2];
    round_shift_32_8xn_avx2((__m256i *)((long)local_8060 + lVar3),0x20,(int)cVar1,4);
    uVar4 = 4;
    round_shift_32_8xn_avx2((__m256i *)((long)local_8040 + lVar3),0x20,(int)cVar1,4);
  }
  store_buffer_avx2(&local_8060,output,0x80,(int)uVar4);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m256i buf0[512], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct64_avx2;
  const transform_1d_avx2 row_txfm = fdct64_avx2;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);
  int r, c;
  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[i << 1], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[i << 1], &buf0[i << 1], cos_bit_col, width_div8, width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < 2; i++) {
    row_txfm(&buf1[i << 1], &buf0[i << 1], cos_bit_row, width_div8,
             width_div16);
    row_txfm(&buf1[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_row, width_div8,
             width_div16);
    round_shift_32_8xn_avx2(&buf0[i << 1], (height >> 1), shift[2],
                            width_div16);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], (height >> 1), shift[2],
                            width_div16);
  }

  store_buffer_avx2(buf0, output, 8, 128);
}